

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_obmc_sub_pixel_variance64x16_c
               (uint8_t *pre,int pre_stride,int xoffset,int yoffset,int32_t *wsrc,int32_t *mask,
               uint *sse)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ushort *puVar4;
  uint8_t *puVar5;
  uint i_1;
  uint j_1;
  uint i;
  int iVar6;
  uint j;
  long lVar7;
  uint16_t fdata3 [1088];
  uint8_t local_cb8 [1024];
  ushort local_8b8 [64];
  ushort local_838 [1028];
  
  puVar5 = local_cb8;
  bVar1 = bilinear_filters_2t[xoffset][0];
  bVar2 = bilinear_filters_2t[xoffset][1];
  puVar4 = local_8b8;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      puVar4[lVar7] =
           (ushort)((uint)pre[lVar7] * (uint)bVar1 + (uint)pre[lVar7 + 1] * (uint)bVar2 + 0x40 >> 7)
      ;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    puVar4 = puVar4 + 0x40;
    pre = pre + (ulong)(pre_stride - 0x40) + 0x40;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x11);
  bVar1 = bilinear_filters_2t[yoffset][0];
  bVar2 = bilinear_filters_2t[yoffset][1];
  puVar4 = local_8b8;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      puVar5[lVar7] =
           (char)((uint)*puVar4 * (uint)bVar1 + (uint)puVar4[0x40] * (uint)bVar2 + 0x40 >> 7);
      puVar4 = puVar4 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    puVar5 = puVar5 + 0x40;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x10);
  uVar3 = aom_obmc_variance64x16_c(local_cb8,0x40,wsrc,mask,sse);
  return uVar3;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}